

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linear_Object_State_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Linear_Object_State_PDU::Decode
          (Linear_Object_State_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  int iVar3;
  LinearSegmentParameter local_c0;
  byte local_56;
  undefined1 local_55;
  KUINT8 i;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Linear_Object_State_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0;
  if ((local_19 & 1) != 0) {
    iVar3 = 0xc;
  }
  if ((uint)KVar1 + iVar3 < 0x28) {
    local_55 = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    local_55 = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  std::
  vector<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
  ::clear(&this->m_vSegments);
  Object_State_Header::Decode(&this->super_Object_State_Header,pKStack_18,(bool)(local_19 & 1));
  pKVar2 = KDataStream::operator>>(pKStack_18,&(this->super_Object_State_Header).field_0x4b);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_ReqID).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_RecvID).super_DataTypeBase);
  DATA_TYPE::operator>>(pKVar2,&(this->m_ObjTyp).super_DataTypeBase);
  for (local_56 = 0; local_56 < (byte)(this->super_Object_State_Header).field_0x4b;
      local_56 = local_56 + 1) {
    DATA_TYPE::LinearSegmentParameter::LinearSegmentParameter(&local_c0,pKStack_18);
    std::
    vector<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
    ::push_back(&this->m_vSegments,&local_c0);
    DATA_TYPE::LinearSegmentParameter::~LinearSegmentParameter(&local_c0);
  }
  return;
}

Assistant:

void Linear_Object_State_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < LINEAR_OBJECT_STATE_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vSegments.clear();

    Object_State_Header::Decode( stream, ignoreHeader );

    stream >> m_ui8NumSegment
           >> KDIS_STREAM m_ReqID
           >> KDIS_STREAM m_RecvID
           >> KDIS_STREAM m_ObjTyp;

    for( KUINT8 i = 0; i < m_ui8NumSegment; ++i )
    {
        m_vSegments.push_back( LinearSegmentParameter( stream ) );
    }
}